

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_chunk.c
# Opt level: O2

void * soa_chunk_alloc(soa_chunk_t *chunk,size_t blockSize)

{
  long lVar1;
  
  if (chunk->freeBlocks != '\0') {
    lVar1 = chunk->firstBlock * blockSize;
    chunk->firstBlock = chunk->blockData[lVar1];
    chunk->freeBlocks = chunk->freeBlocks + 0xff;
    return chunk->blockData + lVar1;
  }
  return (void *)0x0;
}

Assistant:

void *soa_chunk_alloc( soa_chunk_t *chunk,size_t blockSize )
{
  unsigned char *p;
  if(chunk->freeBlocks == 0) return (void*) 0;  
  p = chunk->blockData + (chunk->firstBlock * blockSize);
  chunk->firstBlock = *p; //Index of next available block is stored in byte 0 of the free block
  chunk->freeBlocks--;
  return (void*) p;  
}